

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

bool cashew::JSPrinter::isBlock(Ref node)

{
  bool bVar1;
  Value *pVVar2;
  Ref *this;
  byte local_11;
  Ref local_10;
  Ref node_local;
  
  local_10.inst = node.inst;
  pVVar2 = Ref::operator->(&local_10);
  bVar1 = Value::isArray(pVVar2);
  local_11 = 0;
  if (bVar1) {
    pVVar2 = Ref::operator->(&local_10);
    bVar1 = Value::empty(pVVar2);
    local_11 = 0;
    if (!bVar1) {
      this = (Ref *)cashew::Ref::operator[]((uint)&local_10);
      local_11 = cashew::Ref::operator==(this,(IString *)&BLOCK);
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

static bool isBlock(Ref node) {
    return node->isArray() && !node->empty() && node[0] == BLOCK;
  }